

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
UA_Connection_completeMessages
          (UA_Connection *connection,UA_ByteString *message,UA_Boolean *realloced)

{
  UA_StatusCode UVar1;
  size_t length_00;
  size_t incomplete_length;
  size_t sStack_60;
  UA_StatusCode decode_retval;
  size_t length_pos;
  int local_50;
  UA_UInt32 chunk_length;
  UA_UInt32 msgtype;
  UA_Boolean garbage_end;
  size_t complete_until;
  UA_Byte *data;
  size_t length;
  UA_Boolean *pUStack_28;
  UA_StatusCode retval;
  UA_Boolean *realloced_local;
  UA_ByteString *message_local;
  UA_Connection *connection_local;
  
  length._4_4_ = 0;
  pUStack_28 = realloced;
  realloced_local = (UA_Boolean *)message;
  message_local = (UA_ByteString *)connection;
  if ((connection->incompleteMessage).length != 0) {
    data = (UA_Byte *)((connection->incompleteMessage).length + message->length);
    complete_until = (size_t)realloc((connection->incompleteMessage).data,(size_t)data);
    if ((void *)complete_until == (void *)0x0) {
      length._4_4_ = 0x80030000;
      goto LAB_0011a421;
    }
    memcpy((UA_Byte *)(complete_until + (long)message_local[4].data),*(void **)(realloced_local + 8)
           ,*(size_t *)realloced_local);
    (*(code *)message_local[7].data)(message_local,realloced_local);
    *(size_t *)(realloced_local + 8) = complete_until;
    *(UA_Byte **)realloced_local = data;
    *pUStack_28 = true;
    message_local[4].data = (UA_Byte *)0;
    message_local[5].length = (size_t)(UA_Byte *)0x0;
  }
  chunk_length._3_1_ = 0;
  for (_msgtype = 0; 7 < (ulong)(*(long *)realloced_local - _msgtype);
      _msgtype = (ulong)length_pos._4_4_ + _msgtype) {
    local_50 = (uint)*(byte *)(*(long *)(realloced_local + 8) + _msgtype) +
               (uint)*(byte *)(*(long *)(realloced_local + 8) + 1 + _msgtype) * 0x100 +
               (uint)*(byte *)(*(long *)(realloced_local + 8) + 2 + _msgtype) * 0x10000;
    if (((((local_50 != 0x47534d) && (local_50 != 0x525245)) && (local_50 != 0x4e504f)) &&
        ((local_50 != 0x4c4548 && (local_50 != 0x4b4341)))) && (local_50 != 0x4f4c43)) {
      chunk_length._3_1_ = 1;
      break;
    }
    length_pos._4_4_ = 0;
    sStack_60 = _msgtype + 4;
    UVar1 = UA_UInt32_decodeBinary
                      ((UA_ByteString *)realloced_local,&stack0xffffffffffffffa0,
                       (UA_UInt32 *)((long)&length_pos + 4));
    if (((UVar1 != 0) || (length_pos._4_4_ < 0x10)) ||
       (*(uint *)((long)&message_local->data + 4) < length_pos._4_4_)) {
      chunk_length._3_1_ = 1;
      break;
    }
    if (*(ulong *)realloced_local < (ulong)length_pos._4_4_ + _msgtype) break;
  }
  if (_msgtype == *(long *)realloced_local) {
    return 0;
  }
  if ((chunk_length._3_1_ & 1) == 0) {
    if (_msgtype == 0) {
      if ((*pUStack_28 & 1U) == 0) {
        length._4_4_ = UA_ByteString_allocBuffer
                                 ((UA_ByteString *)&message_local[4].data,*(size_t *)realloced_local
                                 );
        if (length._4_4_ != 0) goto LAB_0011a421;
        memcpy((void *)message_local[5].length,*(void **)(realloced_local + 8),
               *(size_t *)realloced_local);
        (*(code *)message_local[7].data)(message_local,realloced_local);
        *pUStack_28 = true;
      }
      else {
        message_local[4].data = *(UA_Byte **)realloced_local;
        message_local[5].length = *(size_t *)(realloced_local + 8);
        realloced_local[0] = false;
        realloced_local[1] = false;
        realloced_local[2] = false;
        realloced_local[3] = false;
        realloced_local[4] = false;
        realloced_local[5] = false;
        realloced_local[6] = false;
        realloced_local[7] = false;
        *(UA_Byte **)(realloced_local + 8) = (UA_Byte *)0x0;
      }
      return 0;
    }
    length_00 = *(long *)realloced_local - _msgtype;
    length._4_4_ = UA_ByteString_allocBuffer((UA_ByteString *)&message_local[4].data,length_00);
    if (length._4_4_ == 0) {
      memcpy((void *)message_local[5].length,(void *)(*(long *)(realloced_local + 8) + _msgtype),
             length_00);
      *(long *)realloced_local = _msgtype;
      return 0;
    }
  }
  else if (_msgtype != 0) {
    *(long *)realloced_local = _msgtype;
    return 0;
  }
LAB_0011a421:
  if ((*pUStack_28 & 1U) == 0) {
    (*(code *)message_local[7].data)(message_local,realloced_local);
  }
  UA_ByteString_deleteMembers((UA_ByteString *)&message_local[4].data);
  return length._4_4_;
}

Assistant:

UA_StatusCode
UA_Connection_completeMessages(UA_Connection *connection, UA_ByteString *message,
                               UA_Boolean *realloced) {
    UA_StatusCode retval = UA_STATUSCODE_GOOD;

    /* We have a stored an incomplete chunk. Concat the received message to the end.
     * After this block, connection->incompleteMessage is always empty. */
    if(connection->incompleteMessage.length > 0) {
        size_t length = connection->incompleteMessage.length + message->length;
        UA_Byte *data = (UA_Byte*)UA_realloc(connection->incompleteMessage.data, length);
        if(!data) {
            retval = UA_STATUSCODE_BADOUTOFMEMORY;
            goto cleanup;
        }
        memcpy(&data[connection->incompleteMessage.length], message->data, message->length);
        connection->releaseRecvBuffer(connection, message);
        message->data = data;
        message->length = length;
        *realloced = true;
        connection->incompleteMessage = UA_BYTESTRING_NULL;
    }

    /* Loop over the chunks in the received buffer */
    size_t complete_until = 0; /* the received complete chunks end at this point */
    UA_Boolean garbage_end = false; /* garbage after the last complete message */
    while(message->length - complete_until >= 8) {
        /* Check the message type */
        UA_UInt32 msgtype = (UA_UInt32)message->data[complete_until] +
            ((UA_UInt32)message->data[complete_until+1] << 8) +
            ((UA_UInt32)message->data[complete_until+2] << 16);
        if(msgtype != ('M' + ('S' << 8) + ('G' << 16)) &&
           msgtype != ('E' + ('R' << 8) + ('R' << 16)) &&
           msgtype != ('O' + ('P' << 8) + ('N' << 16)) &&
           msgtype != ('H' + ('E' << 8) + ('L' << 16)) &&
           msgtype != ('A' + ('C' << 8) + ('K' << 16)) &&
           msgtype != ('C' + ('L' << 8) + ('O' << 16))) {
            garbage_end = true; /* the message type is not recognized */
            break;
        }

        /* Decode the length of the chunk */
        UA_UInt32 chunk_length = 0;
        size_t length_pos = complete_until + 4;
        UA_StatusCode decode_retval = UA_UInt32_decodeBinary(message, &length_pos, &chunk_length);

        /* The message size is not allowed. Throw the remaining bytestring away */
        if(decode_retval != UA_STATUSCODE_GOOD ||
           chunk_length < 16 ||
           chunk_length > connection->localConf.recvBufferSize) {
            garbage_end = true;
            break;
        }

        /* The chunk is okay but incomplete. Store the end. */
        if(chunk_length + complete_until > message->length)
            break;

        complete_until += chunk_length; /* Go to the next chunk */
    }

    /* Separate incomplete chunks */
    if(complete_until != message->length) {
        /* Garbage after the last good chunk. No need to keep a buffer */
        if(garbage_end) {
            if(complete_until == 0)
                goto cleanup; /* All garbage, only happens on messages from the network layer */
            message->length = complete_until;
            return UA_STATUSCODE_GOOD;
        }

        /* No good chunk, only an incomplete one */
        if(complete_until == 0) {
            if(!*realloced) {
                retval = UA_ByteString_allocBuffer(&connection->incompleteMessage, message->length);
                if(retval != UA_STATUSCODE_GOOD)
                    goto cleanup;
                memcpy(connection->incompleteMessage.data, message->data, message->length);
                connection->releaseRecvBuffer(connection, message);
                *realloced = true;
            } else {
                connection->incompleteMessage = *message;
                *message = UA_BYTESTRING_NULL;
            }
            return UA_STATUSCODE_GOOD;
        }

        /* At least one good chunk and an incomplete one */
        size_t incomplete_length = message->length - complete_until;
        retval = UA_ByteString_allocBuffer(&connection->incompleteMessage, incomplete_length);
        if(retval != UA_STATUSCODE_GOOD)
            goto cleanup;
        memcpy(connection->incompleteMessage.data,
               &message->data[complete_until], incomplete_length);
        message->length = complete_until;
    }

    return UA_STATUSCODE_GOOD;

 cleanup:
    if(!*realloced)
        connection->releaseRecvBuffer(connection, message);
    UA_ByteString_deleteMembers(&connection->incompleteMessage);
    return retval;
}